

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O3

double icu_63::Grego::fieldsToDay(int32_t year,int32_t month,int32_t dom)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar2 = year - 1;
  if (year < 1) {
    uVar3 = -year;
    iVar1 = uVar2 * 0x16d + (~(uVar3 / 400) - (uVar3 >> 2)) + 0x1a444e;
    uVar2 = ~(uVar3 / 100);
  }
  else {
    iVar1 = uVar2 / 400 + (uVar2 >> 2) + uVar2 * 0x16d + 0x1a444f;
    uVar2 = uVar2 / 100;
  }
  if (((year & 3U) != 0) ||
     ((iVar4 = 0xc, (year * -0x3d70a3d7 + 0x51eb850U >> 2 | year * 0x40000000) < 0x28f5c29 &&
      (year != (year / 400) * 400)))) {
    iVar4 = 0;
  }
  return (double)(int)(((dom + iVar1) - uVar2) +
                       (int)*(short *)(DAYS_BEFORE + (long)(iVar4 + month) * 2) + 2) + -2440588.0;
}

Assistant:

double Grego::fieldsToDay(int32_t year, int32_t month, int32_t dom) {

    int32_t y = year - 1;

    double julian = 365 * y + ClockMath::floorDivide(y, 4) + (JULIAN_1_CE - 3) + // Julian cal
        ClockMath::floorDivide(y, 400) - ClockMath::floorDivide(y, 100) + 2 + // => Gregorian cal
        DAYS_BEFORE[month + (isLeapYear(year) ? 12 : 0)] + dom; // => month/dom

    return julian - JULIAN_1970_CE; // JD => epoch day
}